

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration.c
# Opt level: O1

double * inform_integration_evidence_part
                   (int *series,size_t l,size_t n,int *b,size_t *parts,size_t nparts,
                   double *evidence,inform_error *err)

{
  _Bool _Var1;
  size_t *parts_00;
  int *series_00;
  double *pdVar2;
  size_t sVar3;
  double *local_38;
  
  if (series == (int *)0x0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ETIMESERIES;
    }
  }
  else if (l < 2) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOSOURCES;
    }
  }
  else {
    local_38 = evidence;
    if ((evidence == (double *)0x0) &&
       (local_38 = (double *)malloc(n << 4), local_38 == (double *)0x0)) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
    }
    else {
      parts_00 = parts;
      if (parts == (size_t *)0x0) {
        parts_00 = (size_t *)malloc(l * 8);
        if (parts_00 == (size_t *)0x0) {
          if (evidence == (double *)0x0) {
            free(local_38);
          }
          if (err == (inform_error *)0x0) {
            return (double *)0x0;
          }
          *err = INFORM_ENOMEM;
          return (double *)0x0;
        }
        sVar3 = 0;
        do {
          parts_00[sVar3] = sVar3;
          sVar3 = sVar3 + 1;
          nparts = l;
        } while (l + (l == 0) != sVar3);
      }
      series_00 = inform_black_box_parts(series,l,n,b,parts_00,nparts,(int *)0x0,err);
      _Var1 = inform_succeeded(err);
      if (_Var1) {
        inform_local_mutual_info(series_00,nparts,n,series_00 + nparts * n,local_38,err);
      }
      free(series_00);
      if (parts == (size_t *)0x0) {
        free(parts_00);
      }
      _Var1 = inform_failed(err);
      pdVar2 = (double *)0x0;
      if (!_Var1) {
        pdVar2 = local_38;
      }
      if (!_Var1 || evidence != (double *)0x0) {
        return pdVar2;
      }
      free(local_38);
    }
  }
  return (double *)0x0;
}

Assistant:

double *inform_integration_evidence_part(int const *series, size_t l, size_t n,
    int const *b, size_t const *parts, size_t nparts, double *evidence,
    inform_error *err)
{
    if (check_arguments(series, l, err))
    {
        return NULL;
    }
    int allocate_evidence = (evidence == NULL);
    if (allocate_evidence)
    {
        evidence = malloc(2 * n * sizeof(double));
        if (evidence == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }
    size_t *partitioning = (size_t *)parts;
    int allocate_parts = (partitioning == NULL);
    if (allocate_parts)
    {
        partitioning = malloc(l * sizeof(size_t));
        if (partitioning == NULL)
        {
            if (allocate_evidence) free(evidence);
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
        for (size_t i = 0; i < l; ++i) partitioning[i] = i;
        nparts = l;
    }
    int *partitioned = inform_black_box_parts(series, l, n, b, partitioning,
        nparts, NULL, err);
    if (inform_succeeded(err))
    {
        inform_local_mutual_info(partitioned, nparts, n, partitioned + nparts*n,
            evidence, err);
    }
    free(partitioned);
    if (allocate_parts) free(partitioning);
    if (inform_failed(err))
    {
        if (allocate_evidence) free(evidence);
        return NULL;
    }
    return evidence;
}